

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O0

bool __thiscall FIX::Dictionary::getBool(Dictionary *this,string *key)

{
  bool bVar1;
  FieldConvertError *anon_var_0;
  string local_38;
  string *local_18;
  string *key_local;
  Dictionary *this_local;
  
  local_18 = key;
  key_local = (string *)this;
  getString(&local_38,this,key,false);
  bVar1 = BoolConvertor::convert(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool Dictionary::getBool( const std::string& key ) const
EXCEPT ( ConfigError, FieldConvertError )
{
  try
  {
    return BoolConvertor::convert( getString(key) );
  }
  catch ( FieldConvertError& )
  {
    throw ConfigError( "Illegal value " + getString(key) + " for " + key );
  }
}